

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void luaL_checkversion_(lua_State *L,lua_Number ver)

{
  lua_Unsigned lVar1;
  lua_Number *plVar2;
  lua_Number *plVar3;
  lua_Integer lVar4;
  
  plVar2 = lua_version(L);
  plVar3 = lua_version((lua_State *)0x0);
  if (plVar2 == plVar3) {
    if ((*plVar2 != ver) || (NAN(*plVar2) || NAN(ver))) {
      luaL_error(L,"version mismatch: app. needs %f, Lua core provides %f");
    }
  }
  else {
    luaL_error(L,"multiple Lua VMs detected");
  }
  lua_pushnumber(L,-4660.0);
  lVar4 = lua_tointegerx(L,-1,(int *)0x0);
  if (lVar4 == -0x1234) {
    lVar1 = lua_tounsignedx(L,-1,(int *)0x0);
    if (lVar1 == 0xffffedcc) goto LAB_0011354c;
  }
  luaL_error(L,"bad conversion number->int; must recompile Lua with proper settings");
LAB_0011354c:
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_checkversion_ (lua_State *L, lua_Number ver) {
  const lua_Number *v = lua_version(L);
  if (v != lua_version(NULL))
    luaL_error(L, "multiple Lua VMs detected");
  else if (*v != ver)
    luaL_error(L, "version mismatch: app. needs %f, Lua core provides %f",
                  ver, *v);
  /* check conversions number -> integer types */
  lua_pushnumber(L, -(lua_Number)0x1234);
  if (lua_tointeger(L, -1) != -0x1234 ||
      lua_tounsigned(L, -1) != (lua_Unsigned)-0x1234)
    luaL_error(L, "bad conversion number->int;"
                  " must recompile Lua with proper settings");
  lua_pop(L, 1);
}